

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O0

vec2 golf_config_get_vec2(golf_config_t *cfg,char *name)

{
  golf_config_property_t *pgVar1;
  golf_config_property_t *prop;
  char *name_local;
  golf_config_t *cfg_local;
  
  pgVar1 = (golf_config_property_t *)map_get_((map_base_t *)cfg,name);
  (cfg->properties).ref = pgVar1;
  if ((pgVar1 == (golf_config_property_t *)0x0) || (pgVar1->type != GOLF_CONFIG_PROPERTY_VEC2)) {
    golf_log_warning("Invalid config property %s",name);
    cfg_local = (golf_config_t *)vec2_create(0.0,0.0);
  }
  else {
    cfg_local = (golf_config_t *)(pgVar1->field_1).string_val;
  }
  return (vec2)cfg_local;
}

Assistant:

vec2 golf_config_get_vec2(golf_config_t *cfg, const char *name) {
    golf_config_property_t *prop = map_get(&cfg->properties, name);
    if (prop && prop->type == GOLF_CONFIG_PROPERTY_VEC2) {
        return prop->vec2_val;
    }
    else {
        golf_log_warning("Invalid config property %s", name);
        return V2(0, 0);
    }
}